

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O0

int parseHeaderName(QByteArrayView headerName)

{
  QByteArrayView what;
  QByteArrayView what_00;
  QByteArrayView what_01;
  QByteArrayView what_02;
  QByteArrayView what_03;
  QByteArrayView what_04;
  QByteArrayView what_05;
  QByteArrayView what_06;
  QByteArrayView what_07;
  QByteArrayView what_08;
  QByteArrayView what_09;
  QByteArrayView what_10;
  QByteArrayView what_11;
  bool bVar1;
  char cVar2;
  char (*data) [20];
  long in_FS_OFFSET;
  anon_class_16_1_13540c76 is;
  anon_class_16_1_13540c76 *in_stack_fffffffffffffee8;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff04;
  int iVar3;
  storage_type *in_stack_ffffffffffffff08;
  QByteArrayView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QByteArrayView::isEmpty((QByteArrayView *)0x1f44b5);
  if (bVar1) {
    iVar3 = -1;
    goto LAB_001f4887;
  }
  QByteArrayView::front(&local_18);
  cVar2 = QtMiscUtils::toAsciiLower('\0');
  data = (char (*) [20])(ulong)((int)cVar2 - 99);
  switch(data) {
  case (char (*) [20])0x0:
    QByteArrayView::QByteArrayView<13ul>
              ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (char (*) [13])data);
    what.m_size._4_4_ = in_stack_ffffffffffffff04;
    what.m_size._0_4_ = in_stack_ffffffffffffff00;
    what.m_data = in_stack_ffffffffffffff08;
    bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(in_stack_fffffffffffffee8,what);
    if (bVar1) {
      iVar3 = 0;
      goto LAB_001f4887;
    }
    QByteArrayView::QByteArrayView<15ul>
              ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (char (*) [15])data);
    what_00.m_size._4_4_ = in_stack_ffffffffffffff04;
    what_00.m_size._0_4_ = in_stack_ffffffffffffff00;
    what_00.m_data = in_stack_ffffffffffffff08;
    bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(in_stack_fffffffffffffee8,what_00)
    ;
    if (bVar1) {
      iVar3 = 1;
      goto LAB_001f4887;
    }
    QByteArrayView::QByteArrayView<7ul>
              ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (char (*) [7])data);
    what_01.m_size._4_4_ = in_stack_ffffffffffffff04;
    what_01.m_size._0_4_ = in_stack_ffffffffffffff00;
    what_01.m_data = in_stack_ffffffffffffff08;
    bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(in_stack_fffffffffffffee8,what_01)
    ;
    if (bVar1) {
      iVar3 = 4;
      goto LAB_001f4887;
    }
    QByteArrayView::QByteArrayView<20ul>
              ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),data)
    ;
    what_02.m_size._4_4_ = in_stack_ffffffffffffff04;
    what_02.m_size._0_4_ = in_stack_ffffffffffffff00;
    what_02.m_data = in_stack_ffffffffffffff08;
    bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(in_stack_fffffffffffffee8,what_02)
    ;
    if (bVar1) {
      iVar3 = 6;
      goto LAB_001f4887;
    }
    break;
  case (char (*) [20])0x2:
    QByteArrayView::QByteArrayView<5ul>
              ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (char (*) [5])data);
    what_03.m_size._4_4_ = in_stack_ffffffffffffff04;
    what_03.m_size._0_4_ = in_stack_ffffffffffffff00;
    what_03.m_data = in_stack_ffffffffffffff08;
    bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(in_stack_fffffffffffffee8,what_03)
    ;
    if (bVar1) {
      iVar3 = 10;
      goto LAB_001f4887;
    }
    break;
  case (char (*) [20])0x6:
    QByteArrayView::QByteArrayView<18ul>
              ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (char (*) [18])data);
    what_04.m_size._4_4_ = in_stack_ffffffffffffff04;
    what_04.m_size._0_4_ = in_stack_ffffffffffffff00;
    what_04.m_data = in_stack_ffffffffffffff08;
    bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(in_stack_fffffffffffffee8,what_04)
    ;
    if (bVar1) {
      iVar3 = 9;
      goto LAB_001f4887;
    }
    QByteArrayView::QByteArrayView<9ul>
              ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (char (*) [9])data);
    what_05.m_size._4_4_ = in_stack_ffffffffffffff04;
    what_05.m_size._0_4_ = in_stack_ffffffffffffff00;
    what_05.m_data = in_stack_ffffffffffffff08;
    bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(in_stack_fffffffffffffee8,what_05)
    ;
    if (bVar1) {
      iVar3 = 0xb;
      goto LAB_001f4887;
    }
    QByteArrayView::QByteArrayView<14ul>
              ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (char (*) [14])data);
    what_06.m_size._4_4_ = in_stack_ffffffffffffff04;
    what_06.m_size._0_4_ = in_stack_ffffffffffffff00;
    what_06.m_data = in_stack_ffffffffffffff08;
    bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(in_stack_fffffffffffffee8,what_06)
    ;
    if (bVar1) {
      iVar3 = 0xc;
      goto LAB_001f4887;
    }
    break;
  case (char (*) [20])0x9:
    QByteArrayView::QByteArrayView<9ul>
              ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (char (*) [9])data);
    what_07.m_size._4_4_ = in_stack_ffffffffffffff04;
    what_07.m_size._0_4_ = in_stack_ffffffffffffff00;
    what_07.m_data = in_stack_ffffffffffffff08;
    bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(in_stack_fffffffffffffee8,what_07)
    ;
    if (bVar1) {
      iVar3 = 2;
      goto LAB_001f4887;
    }
    QByteArrayView::QByteArrayView<14ul>
              ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (char (*) [14])data);
    what_08.m_size._4_4_ = in_stack_ffffffffffffff04;
    what_08.m_size._0_4_ = in_stack_ffffffffffffff00;
    what_08.m_data = in_stack_ffffffffffffff08;
    bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(in_stack_fffffffffffffee8,what_08)
    ;
    if (bVar1) {
      iVar3 = 3;
      goto LAB_001f4887;
    }
    break;
  case (char (*) [20])0x10:
    QByteArrayView::QByteArrayView<11ul>
              ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (char (*) [11])data);
    what_09.m_size._4_4_ = in_stack_ffffffffffffff04;
    what_09.m_size._0_4_ = in_stack_ffffffffffffff00;
    what_09.m_data = in_stack_ffffffffffffff08;
    bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(in_stack_fffffffffffffee8,what_09)
    ;
    if (bVar1) {
      iVar3 = 5;
      goto LAB_001f4887;
    }
    QByteArrayView::QByteArrayView<7ul>
              ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (char (*) [7])data);
    what_10.m_size._4_4_ = in_stack_ffffffffffffff04;
    what_10.m_size._0_4_ = in_stack_ffffffffffffff00;
    what_10.m_data = in_stack_ffffffffffffff08;
    bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(in_stack_fffffffffffffee8,what_10)
    ;
    if (bVar1) {
      iVar3 = 8;
      goto LAB_001f4887;
    }
    break;
  case (char (*) [20])0x12:
    QByteArrayView::QByteArrayView<11ul>
              ((QByteArrayView *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
               (char (*) [11])data);
    what_11.m_size._4_4_ = in_stack_ffffffffffffff04;
    what_11.m_size._0_4_ = in_stack_ffffffffffffff00;
    what_11.m_data = in_stack_ffffffffffffff08;
    bVar1 = parseHeaderName::anon_class_16_1_13540c76::operator()(in_stack_fffffffffffffee8,what_11)
    ;
    if (bVar1) {
      iVar3 = 7;
      goto LAB_001f4887;
    }
  }
  iVar3 = -1;
LAB_001f4887:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return iVar3;
  }
  __stack_chk_fail();
}

Assistant:

static int parseHeaderName(QByteArrayView headerName)
{
    if (headerName.isEmpty())
        return -1;

    auto is = [headerName](QByteArrayView what) {
        return headerName.compare(what, Qt::CaseInsensitive) == 0;
    };

    switch (QtMiscUtils::toAsciiLower(headerName.front())) {
    case 'c':
        if (is("content-type"))
            return QNetworkRequest::ContentTypeHeader;
        else if (is("content-length"))
            return QNetworkRequest::ContentLengthHeader;
        else if (is("cookie"))
            return QNetworkRequest::CookieHeader;
        else if (is("content-disposition"))
            return QNetworkRequest::ContentDispositionHeader;
        break;

    case 'e':
        if (is("etag"))
            return QNetworkRequest::ETagHeader;
        break;

    case 'i':
        if (is("if-modified-since"))
            return QNetworkRequest::IfModifiedSinceHeader;
        if (is("if-match"))
            return QNetworkRequest::IfMatchHeader;
        if (is("if-none-match"))
            return QNetworkRequest::IfNoneMatchHeader;
        break;

    case 'l':
        if (is("location"))
            return QNetworkRequest::LocationHeader;
        else if (is("last-modified"))
            return QNetworkRequest::LastModifiedHeader;
        break;

    case 's':
        if (is("set-cookie"))
            return QNetworkRequest::SetCookieHeader;
        else if (is("server"))
            return QNetworkRequest::ServerHeader;
        break;

    case 'u':
        if (is("user-agent"))
            return QNetworkRequest::UserAgentHeader;
        break;
    }

    return -1; // nothing found
}